

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

void removeRowsOfCountOne(HighsLogOptions *log_options,HighsLp *lp)

{
  vector<int,_std::allocator<int>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  pointer pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  size_type sVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  vector<int,_std::allocator<int>_> ar_start;
  vector<int,_std::allocator<int>_> ar_index;
  vector<double,_std::allocator<double>_> ar_value;
  vector<int,_std::allocator<int>_> a_count;
  vector<int,_std::allocator<int>_> ar_count;
  HighsLp row_wise_lp;
  value_type_conflict2 local_48c;
  vector<int,_std::allocator<int>_> local_488;
  uint local_46c;
  vector<int,_std::allocator<int>_> local_468;
  vector<double,_std::allocator<double>_> local_448;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_430;
  pointer local_428;
  pointer local_420;
  vector<int,_std::allocator<int>_> local_418;
  vector<int,_std::allocator<int>_> local_3f8;
  HighsLogOptions *local_3d8;
  HighsLp *local_3d0;
  HighsLp local_3c8;
  
  HighsLp::HighsLp(&local_3c8,lp);
  local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_420 = (lp->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_428 = (lp->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  sVar12 = (size_type)
           (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lp->num_col_];
  local_48c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_3f8,(long)lp->num_row_,&local_48c);
  if (0 < lp->num_col_) {
    piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      lVar8 = (long)piVar2[lVar6];
      lVar7 = lVar6 + 1;
      if (piVar2[lVar6] < piVar2[lVar6 + 1]) {
        do {
          local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[piVar3[lVar8]] =
               local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[piVar3[lVar8]] + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 < piVar2[lVar7]);
      }
      lVar6 = lVar7;
    } while (lVar7 < lp->num_col_);
  }
  local_48c = 0;
  local_3d8 = log_options;
  if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_488,
               (iterator)
               local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_48c);
  }
  else {
    *local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  if (0 < lp->num_row_) {
    lVar6 = 0;
    do {
      local_48c = local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6] +
                  local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
      if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_488,
                   (iterator)
                   local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_48c);
      }
      else {
        *local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_48c;
        local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] =
           local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 < lp->num_row_);
  }
  std::vector<int,_std::allocator<int>_>::resize(&local_468,sVar12);
  std::vector<double,_std::allocator<double>_>::resize(&local_448,sVar12);
  if (0 < lp->num_col_) {
    piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      lVar8 = (long)piVar2[lVar6];
      lVar7 = lVar6 + 1;
      if (piVar2[lVar6] < piVar2[lVar6 + 1]) {
        do {
          iVar9 = piVar3[lVar8];
          local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar9]] = (int)lVar6;
          iVar11 = local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar9];
          local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar11] = pdVar5[lVar8];
          local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar9] = iVar11 + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 < piVar2[lVar7]);
      }
      lVar6 = lVar7;
    } while (lVar7 < lp->num_col_);
  }
  local_430 = &lp->row_names_;
  if (lp->num_row_ < 1) {
    iVar9 = 0;
    iVar11 = 0;
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    lVar7 = 0;
    iVar9 = 0;
    lVar6 = 0;
    local_3d0 = lp;
    do {
      lVar8 = lVar6 + 1;
      iVar11 = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar6];
      if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar6 + 1] - iVar11 == 1) {
        iVar1 = local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar11];
        dVar13 = local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar11];
        if (dVar13 <= 0.0) {
          dVar14 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6];
          if (dVar14 != -INFINITY) {
            dVar14 = dVar14 / dVar13;
            pdVar5 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar15 = pdVar5[iVar1];
            if (dVar14 <= dVar15) {
              dVar15 = dVar14;
            }
            pdVar5[iVar1] = dVar15;
          }
          dVar14 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6];
          if (dVar14 != INFINITY) {
            dVar14 = dVar14 / dVar13;
            pdVar5 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar13 = pdVar5[iVar1];
            if (pdVar5[iVar1] <= dVar14) {
              dVar13 = dVar14;
            }
            goto LAB_0024999f;
          }
        }
        else {
          dVar14 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6];
          if (dVar14 != -INFINITY) {
            dVar14 = dVar14 / dVar13;
            pdVar5 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar15 = pdVar5[iVar1];
            if (dVar15 <= dVar14) {
              dVar15 = dVar14;
            }
            pdVar5[iVar1] = dVar15;
          }
          dVar14 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6];
          if (dVar14 != INFINITY) {
            dVar14 = dVar14 / dVar13;
            pdVar5 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar13 = pdVar5[iVar1];
            if (dVar14 <= pdVar5[iVar1]) {
              dVar13 = dVar14;
            }
LAB_0024999f:
            pdVar5[iVar1] = dVar13;
          }
        }
        uVar10 = uVar10 + 1;
      }
      else {
        pdVar5 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5[iVar9] = pdVar5[lVar6];
        pdVar5 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5[iVar9] = pdVar5[lVar6];
        if (local_420 != local_428) {
          std::__cxx11::string::_M_assign
                    ((string *)
                     ((local_430->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + iVar9));
          lp = local_3d0;
        }
        local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar9] = (int)lVar7;
        lVar4 = (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar6];
        if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar6] <
            local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar8]) {
          lVar7 = (long)(int)lVar7;
          do {
            local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar7] =
                 local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
            local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7] =
                 local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
            lVar7 = lVar7 + 1;
            lVar4 = lVar4 + 1;
          } while (lVar4 < local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar8]);
        }
        iVar9 = iVar9 + 1;
      }
      iVar11 = (int)lVar7;
      lVar6 = lVar8;
    } while (lVar8 < lp->num_row_);
  }
  sVar12 = (size_type)iVar9;
  local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [sVar12] = iVar11;
  lp->num_row_ = iVar9;
  local_46c = uVar10;
  std::vector<double,_std::allocator<double>_>::resize(&lp->row_lower_,sVar12);
  std::vector<double,_std::allocator<double>_>::resize(&lp->row_upper_,sVar12);
  if (local_420 != local_428) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(local_430,sVar12);
  }
  iVar9 = local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lp->num_row_];
  local_48c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_418,(long)lp->num_col_,&local_48c);
  if (0 < lp->num_row_) {
    lVar6 = 0;
    do {
      lVar8 = (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6];
      lVar7 = lVar6 + 1;
      if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar6] <
          local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar6 + 1]) {
        do {
          local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8]] =
               local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8]] + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar7]);
      }
      lVar6 = lVar7;
    } while (lVar7 < lp->num_row_);
  }
  this = &(lp->a_matrix_).index_;
  piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar2 = 0;
  if (0 < lp->num_col_) {
    lVar6 = 0;
    do {
      piVar2[lVar6 + 1] =
           local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar6] + piVar2[lVar6];
      local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] = piVar2[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 < lp->num_col_);
  }
  std::vector<int,_std::allocator<int>_>::resize(this,(long)iVar9);
  this_00 = &(lp->a_matrix_).value_;
  std::vector<double,_std::allocator<double>_>::resize(this_00,(long)iVar9);
  if (0 < lp->num_row_) {
    piVar2 = (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar5 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      lVar8 = (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6];
      lVar7 = lVar6 + 1;
      if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar6] <
          local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar6 + 1]) {
        do {
          iVar9 = local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
          piVar2[local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar9]] = (int)lVar6;
          iVar11 = local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar9];
          pdVar5[iVar11] =
               local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8];
          local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar9] = iVar11 + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar7]);
      }
      lVar6 = lVar7;
    } while (lVar7 < lp->num_row_);
  }
  highsLogUser(local_3d8,kWarning,"Removed %d rows of count 1\n",(ulong)local_46c);
  if (local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HighsLp::~HighsLp(&local_3c8);
  return;
}

Assistant:

void removeRowsOfCountOne(const HighsLogOptions& log_options, HighsLp& lp) {
  HighsLp row_wise_lp = lp;
  vector<HighsInt>& a_start = lp.a_matrix_.start_;
  vector<HighsInt>& a_index = lp.a_matrix_.index_;
  vector<double>& a_value = lp.a_matrix_.value_;
  vector<HighsInt> a_count;
  vector<HighsInt> ar_count;
  vector<HighsInt> ar_start;
  vector<HighsInt> ar_index;
  vector<double> ar_value;
  const bool has_name = lp.row_names_.size() > 0;
  HighsInt num_nz = a_start[lp.num_col_];
  const HighsInt original_num_nz = num_nz;
  const HighsInt original_num_row = lp.num_row_;
  HighsInt num_row_count_1 = 0;
  ar_count.assign(lp.num_row_, 0);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++)
      ar_count[a_index[iEl]]++;
  }
  ar_start.push_back(0);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    ar_start.push_back(ar_start[iRow] + ar_count[iRow]);
    ar_count[iRow] = ar_start[iRow];
  }
  ar_index.resize(num_nz);
  ar_value.resize(num_nz);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
      HighsInt iRow = a_index[iEl];
      ar_index[ar_count[iRow]] = iCol;
      ar_value[ar_count[iRow]] = a_value[iEl];
      ar_count[iRow]++;
    }
  }
  HighsInt newRow = 0;
  HighsInt newEl = 0;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    const HighsInt row_count = ar_start[iRow + 1] - ar_start[iRow];
    if (row_count == 1) {
      HighsInt iCol = ar_index[ar_start[iRow]];
      double value = ar_value[ar_start[iRow]];
      assert(value);
      if (value > 0) {
        if (lp.row_lower_[iRow] > -kHighsInf)
          lp.col_lower_[iCol] =
              std::max(lp.row_lower_[iRow] / value, lp.col_lower_[iCol]);
        if (lp.row_upper_[iRow] < kHighsInf)
          lp.col_upper_[iCol] =
              std::min(lp.row_upper_[iRow] / value, lp.col_upper_[iCol]);
      } else {
        if (lp.row_lower_[iRow] > -kHighsInf)
          lp.col_upper_[iCol] =
              std::min(lp.row_lower_[iRow] / value, lp.col_upper_[iCol]);
        if (lp.row_upper_[iRow] < kHighsInf)
          lp.col_lower_[iCol] =
              std::max(lp.row_upper_[iRow] / value, lp.col_lower_[iCol]);
      }
      num_row_count_1++;
      continue;
    }
    lp.row_lower_[newRow] = lp.row_lower_[iRow];
    lp.row_upper_[newRow] = lp.row_upper_[iRow];
    if (has_name) lp.row_names_[newRow] = lp.row_names_[iRow];
    ar_start[newRow] = newEl;
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++) {
      ar_index[newEl] = ar_index[iEl];
      ar_value[newEl] = ar_value[iEl];
      newEl++;
    }
    newRow++;
  }
  ar_start[newRow] = newEl;
  lp.num_row_ = newRow;
  lp.row_lower_.resize(newRow);
  lp.row_upper_.resize(newRow);
  if (has_name) lp.row_names_.resize(newRow);

  num_nz = ar_start[lp.num_row_];
  a_count.assign(lp.num_col_, 0);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++)
      a_count[ar_index[iEl]]++;
  }
  a_start[0] = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    a_start[iCol + 1] = a_start[iCol] + a_count[iCol];
    a_count[iCol] = a_start[iCol];
  }
  a_index.resize(num_nz);
  a_value.resize(num_nz);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++) {
      HighsInt iCol = ar_index[iEl];
      a_index[a_count[iCol]] = iRow;
      a_value[a_count[iCol]] = ar_value[iEl];
      a_count[iCol]++;
    }
  }
  assert(original_num_row - lp.num_row_ == num_row_count_1);
  assert(original_num_nz - num_nz == num_row_count_1);
  highsLogUser(log_options, HighsLogType::kWarning,
               "Removed %d rows of count 1\n", (int)num_row_count_1);
}